

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::has_filename(Twine *path,Style style)

{
  uint *puVar1;
  undefined1 local_d8 [8];
  SmallString<128U> path_storage;
  reverse_iterator I;
  
  puVar1 = &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_d8 = (undefined1  [8])puVar1;
  join_0x00000010_0x00000000_ = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_d8);
  reverse_iterator::operator++
            ((reverse_iterator *)
             (path_storage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
              InlineElts + 0x78));
  if (local_d8 != (undefined1  [8])puVar1) {
    free((void *)local_d8);
  }
  return false;
}

Assistant:

bool has_filename(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !filename(p, style).empty();
}